

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

string * nite::subStr(string *__return_storage_ptr__,string *string,uint start,uint end)

{
  ulong uVar1;
  char *pcVar2;
  allocator local_39;
  uint local_38;
  uint i;
  allocator local_22;
  undefined1 local_21;
  uint local_20;
  uint local_1c;
  uint end_local;
  uint start_local;
  string *string_local;
  string *sub;
  
  local_20 = end;
  local_1c = start;
  _end_local = string;
  string_local = __return_storage_ptr__;
  uVar1 = std::__cxx11::string::length();
  if (start < uVar1) {
    local_21 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_22);
    std::allocator<char>::~allocator((allocator<char> *)&local_22);
    for (local_38 = local_1c; local_38 <= local_20; local_38 = local_38 + 1) {
      pcVar2 = (char *)std::__cxx11::string::at((ulong)_end_local);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar2);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return __return_storage_ptr__;
}

Assistant:

String nite::subStr(const String &string, unsigned start, unsigned end){
    if (start<string.length() and start>=0){
        String sub = "";
        for (unsigned i=start; i<=end; i++){
            sub+=string.at(i);
        }
        return sub;
    }
    return "";
}